

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t2.c
# Opt level: O2

OPJ_BOOL opj_t2_read_packet_header
                   (opj_t2_t *p_t2,opj_tcd_tile_t *p_tile,opj_tcp_t *p_tcp,opj_pi_iterator_t *p_pi,
                   OPJ_BOOL *p_is_data_present,OPJ_BYTE *p_src_data,OPJ_UINT32 *p_data_read,
                   OPJ_UINT32 p_max_length,opj_packet_info_t *p_pack_info,opj_event_mgr_t *p_manager
                   )

{
  uint uVar1;
  opj_cp_t *poVar2;
  opj_tcd_precinct_t *poVar3;
  opj_tcd_seg_t *poVar4;
  OPJ_BYTE *pOVar5;
  OPJ_UINT32 OVar6;
  uint uVar7;
  OPJ_BOOL OVar8;
  OPJ_UINT32 OVar9;
  OPJ_UINT32 OVar10;
  OPJ_UINT32 *pOVar11;
  opj_bio_t *bio;
  ptrdiff_t pVar12;
  char *pcVar13;
  OPJ_UINT32 i;
  int iVar14;
  OPJ_UINT32 OVar15;
  opj_tcd_band_t *poVar16;
  ulong uVar17;
  OPJ_BYTE *pOVar18;
  opj_tcd_resolution_t *poVar19;
  opj_tcd_cblk_dec_t *cblk;
  bool bVar20;
  OPJ_BYTE **local_a0;
  int local_98;
  OPJ_BYTE *l_current_data;
  OPJ_UINT32 local_70;
  uint local_6c;
  opj_tcd_precinct_t *local_68;
  OPJ_BOOL *local_60;
  opj_tcd_band_t *local_58;
  opj_tcd_resolution_t *local_50;
  opj_tcd_cblk_dec_t *local_48;
  OPJ_BYTE *local_40;
  OPJ_UINT32 l_remaining_length;
  
  poVar2 = p_t2->cp;
  poVar19 = p_tile->comps[p_pi->compno].resolutions + p_pi->resno;
  l_current_data = p_src_data;
  local_60 = p_is_data_present;
  local_50 = poVar19;
  if (p_pi->layno == 0) {
    poVar16 = poVar19->bands;
    for (uVar7 = 0; uVar7 < poVar19->numbands; uVar7 = uVar7 + 1) {
      OVar8 = opj_tcd_is_band_empty(poVar16);
      if (OVar8 == 0) {
        uVar1 = p_pi->precno;
        if (poVar16->precincts_data_size / 0x38 <= uVar1) {
          opj_event_msg((opj_event_mgr_t *)p_pack_info,1,"Invalid precinct\n");
          return 0;
        }
        poVar3 = poVar16->precincts;
        opj_tgt_reset(poVar3[uVar1].incltree);
        opj_tgt_reset(poVar3[uVar1].imsbtree);
        iVar14 = poVar3[uVar1].ch * poVar3[uVar1].cw;
        pOVar11 = &(poVar3[uVar1].cblks.enc)->numpasses;
        while (bVar20 = iVar14 != 0, iVar14 = iVar14 + -1, poVar19 = local_50, bVar20) {
          *(undefined8 *)(pOVar11 + -1) = 0;
          pOVar11 = pOVar11 + 0x14;
        }
      }
      poVar16 = poVar16 + 1;
    }
  }
  pOVar18 = p_src_data;
  if ((p_tcp->csty & 2) != 0) {
    if (p_max_length < 6) {
      pcVar13 = "Not enough space for expected SOP marker\n";
    }
    else {
      if ((*p_src_data == 0xff) && (p_src_data[1] == 0x91)) {
        pOVar18 = p_src_data + 6;
        l_current_data = pOVar18;
        goto LAB_0013b672;
      }
      pcVar13 = "Expected SOP marker\n";
    }
    opj_event_msg((opj_event_mgr_t *)p_pack_info,2,pcVar13);
  }
LAB_0013b672:
  bio = opj_bio_create();
  if (bio == (opj_bio_t *)0x0) {
LAB_0013ba67:
    OVar8 = 0;
  }
  else {
    local_98 = (int)p_src_data;
    if ((poVar2->field_0x9c & 1) == 0) {
      if ((p_tcp->field_0x1638 & 2) == 0) {
        pOVar11 = &l_remaining_length;
        l_remaining_length = (p_max_length + local_98) - (int)pOVar18;
        local_a0 = &l_current_data;
      }
      else {
        local_a0 = &p_tcp->ppt_data;
        pOVar18 = p_tcp->ppt_data;
        pOVar11 = &p_tcp->ppt_len;
      }
    }
    else {
      local_a0 = &poVar2->ppm_data;
      pOVar18 = poVar2->ppm_data;
      pOVar11 = &poVar2->ppm_len;
    }
    opj_bio_init_dec(bio,pOVar18,*pOVar11);
    OVar6 = opj_bio_read(bio,1);
    if (OVar6 == 0) {
      opj_bio_inalign(bio);
      pVar12 = opj_bio_numbytes(bio);
      pOVar18 = pOVar18 + pVar12;
      opj_bio_destroy(bio);
      if ((p_tcp->csty & 4) != 0) {
        if ((*(int *)local_a0 - (int)pOVar18) + *pOVar11 < 2) {
          pcVar13 = "Not enough space for expected EPH marker\n";
        }
        else {
          if ((*pOVar18 == 0xff) && (pOVar18[1] == 0x92)) {
            pOVar18 = pOVar18 + 2;
            goto LAB_0013bb44;
          }
          pcVar13 = "Expected EPH marker\n";
        }
        opj_event_msg((opj_event_mgr_t *)p_pack_info,2,pcVar13);
      }
LAB_0013bb44:
      pOVar5 = *local_a0;
      uVar7 = (int)pOVar18 - (int)pOVar5;
      *pOVar11 = *pOVar11 - uVar7;
      *local_a0 = pOVar5 + uVar7;
      *local_60 = 0;
    }
    else {
      poVar16 = poVar19->bands;
      uVar7 = 0;
      local_40 = pOVar18;
      while (pOVar18 = local_40, uVar7 < poVar19->numbands) {
        poVar3 = poVar16->precincts;
        uVar1 = p_pi->precno;
        local_6c = uVar7;
        local_58 = poVar16;
        OVar8 = opj_tcd_is_band_empty(poVar16);
        if (OVar8 == 0) {
          local_68 = poVar3 + uVar1;
          local_70 = poVar3[uVar1].ch * poVar3[uVar1].cw;
          cblk = poVar3[uVar1].cblks.dec;
          for (OVar6 = 0; OVar6 != local_70; OVar6 = OVar6 + 1) {
            if (cblk->numsegs == 0) {
              OVar9 = opj_tgt_decode(bio,local_68->incltree,OVar6,p_pi->layno + 1);
            }
            else {
              OVar9 = opj_bio_read(bio,1);
            }
            poVar3 = local_68;
            OVar10 = 1;
            if (OVar9 == 0) {
              cblk->numnewpasses = 0;
            }
            else {
              if (cblk->numsegs == 0) {
                iVar14 = 0;
                local_48 = cblk;
                do {
                  OVar9 = opj_tgt_decode(bio,poVar3->imsbtree,OVar6,iVar14);
                  iVar14 = iVar14 + 1;
                } while (OVar9 == 0);
                OVar9 = local_58->numbps;
                local_48->Mb = OVar9;
                local_48->numbps = (OVar9 - iVar14) + 2;
                local_48->numlenbits = 3;
                cblk = local_48;
              }
              OVar9 = opj_bio_read(bio,1);
              if (OVar9 != 0) {
                OVar9 = opj_bio_read(bio,1);
                OVar10 = 2;
                if (OVar9 != 0) {
                  OVar10 = opj_bio_read(bio,2);
                  if (OVar10 == 3) {
                    OVar10 = opj_bio_read(bio,5);
                    if (OVar10 == 0x1f) {
                      OVar10 = opj_bio_read(bio,7);
                      OVar10 = OVar10 + 0x25;
                    }
                    else {
                      OVar10 = OVar10 + 6;
                    }
                  }
                  else {
                    OVar10 = OVar10 + 3;
                  }
                }
              }
              cblk->numnewpasses = OVar10;
              iVar14 = -1;
              do {
                OVar9 = opj_bio_read(bio,1);
                iVar14 = iVar14 + 1;
              } while (OVar9 != 0);
              cblk->numlenbits = cblk->numlenbits + iVar14;
              uVar7 = cblk->numsegs;
              if (uVar7 == 0) {
                uVar17 = 0;
                iVar14 = opj_t2_init_seg(cblk,0,p_tcp->tccps[p_pi->compno].cblksty,1);
LAB_0013b92a:
                if (iVar14 == 0) goto LAB_0013ba62;
              }
              else {
                uVar17 = (ulong)(uVar7 - 1);
                if (cblk->segs[uVar17].numpasses == cblk->segs[uVar17].maxpasses) {
                  iVar14 = opj_t2_init_seg(cblk,uVar7,p_tcp->tccps[p_pi->compno].cblksty,0);
                  uVar17 = (ulong)uVar7;
                  goto LAB_0013b92a;
                }
              }
              OVar9 = cblk->numnewpasses;
              if ((p_tcp->tccps[p_pi->compno].cblksty & 0x40) == 0) {
                do {
                  poVar4 = cblk->segs;
                  OVar10 = poVar4[uVar17].maxpasses - poVar4[uVar17].numpasses;
                  if ((int)OVar9 <= (int)OVar10) {
                    OVar10 = OVar9;
                  }
                  poVar4[uVar17].numnewpasses = OVar10;
                  OVar15 = cblk->numlenbits;
                  OVar10 = opj_uint_floorlog2(OVar10);
                  uVar7 = OVar10 + OVar15;
                  if (0x20 < uVar7) {
LAB_0013baa3:
                    opj_event_msg((opj_event_mgr_t *)p_pack_info,1,
                                  "Invalid bit number %d in opj_t2_read_packet_header()\n",
                                  (ulong)uVar7);
                    opj_bio_destroy(bio);
                    return 0;
                  }
                  OVar10 = opj_bio_read(bio,uVar7);
                  poVar4 = cblk->segs;
                  poVar4[uVar17].newlen = OVar10;
                  OVar10 = poVar4[uVar17].numnewpasses;
                  OVar15 = OVar9 - OVar10;
                  if (OVar15 == 0 || (int)OVar9 < (int)OVar10) goto LAB_0013b880;
                  uVar7 = (int)uVar17 + 1;
                  uVar17 = (ulong)uVar7;
                  OVar8 = opj_t2_init_seg(cblk,uVar7,p_tcp->tccps[p_pi->compno].cblksty,0);
                  OVar9 = OVar15;
                  if (OVar8 == 0) goto LAB_0013ba62;
                } while( true );
              }
              while( true ) {
                OVar10 = OVar9;
                if ((int)uVar17 == 0) {
                  OVar10 = 1;
                }
                cblk->segs[uVar17].numnewpasses = OVar10;
                OVar15 = cblk->numlenbits;
                OVar10 = opj_uint_floorlog2(OVar10);
                uVar7 = OVar10 + OVar15;
                if (0x20 < uVar7) goto LAB_0013baa3;
                OVar10 = opj_bio_read(bio,uVar7);
                poVar4 = cblk->segs;
                poVar4[uVar17].newlen = OVar10;
                OVar10 = poVar4[uVar17].numnewpasses;
                OVar15 = OVar9 - OVar10;
                if (OVar15 == 0 || (int)OVar9 < (int)OVar10) break;
                uVar7 = (int)uVar17 + 1;
                uVar17 = (ulong)uVar7;
                OVar8 = opj_t2_init_seg(cblk,uVar7,p_tcp->tccps[p_pi->compno].cblksty,0);
                OVar9 = OVar15;
                if (OVar8 == 0) goto LAB_0013ba62;
              }
            }
LAB_0013b880:
            cblk = cblk + 1;
          }
        }
        poVar16 = local_58 + 1;
        poVar19 = local_50;
        uVar7 = local_6c + 1;
      }
      OVar8 = opj_bio_inalign(bio);
      if (OVar8 == 0) {
LAB_0013ba62:
        opj_bio_destroy(bio);
        goto LAB_0013ba67;
      }
      pVar12 = opj_bio_numbytes(bio);
      pOVar18 = pOVar18 + pVar12;
      opj_bio_destroy(bio);
      if ((p_tcp->csty & 4) != 0) {
        if ((*(int *)local_a0 - (int)pOVar18) + *pOVar11 < 2) {
          pcVar13 = "Not enough space for expected EPH marker\n";
        }
        else {
          if ((*pOVar18 == 0xff) && (pOVar18[1] == 0x92)) {
            pOVar18 = pOVar18 + 2;
            goto LAB_0013bc1b;
          }
          pcVar13 = "Expected EPH marker\n";
        }
        opj_event_msg((opj_event_mgr_t *)p_pack_info,2,pcVar13);
      }
LAB_0013bc1b:
      pOVar5 = *local_a0;
      uVar7 = (int)pOVar18 - (int)pOVar5;
      *pOVar11 = *pOVar11 - uVar7;
      *local_a0 = pOVar5 + uVar7;
      *local_60 = 1;
    }
    *p_data_read = (int)l_current_data - local_98;
    OVar8 = 1;
  }
  return OVar8;
}

Assistant:

static OPJ_BOOL opj_t2_read_packet_header(opj_t2_t* p_t2,
        opj_tcd_tile_t *p_tile,
        opj_tcp_t *p_tcp,
        opj_pi_iterator_t *p_pi,
        OPJ_BOOL * p_is_data_present,
        OPJ_BYTE *p_src_data,
        OPJ_UINT32 * p_data_read,
        OPJ_UINT32 p_max_length,
        opj_packet_info_t *p_pack_info,
        opj_event_mgr_t *p_manager)

{
    /* loop */
    OPJ_UINT32 bandno, cblkno;
    OPJ_UINT32 l_nb_code_blocks;
    OPJ_UINT32 l_remaining_length;
    OPJ_UINT32 l_header_length;
    OPJ_UINT32 * l_modified_length_ptr = 00;
    OPJ_BYTE *l_current_data = p_src_data;
    opj_cp_t *l_cp = p_t2->cp;
    opj_bio_t *l_bio = 00;  /* BIO component */
    opj_tcd_band_t *l_band = 00;
    opj_tcd_cblk_dec_t* l_cblk = 00;
    opj_tcd_resolution_t* l_res =
        &p_tile->comps[p_pi->compno].resolutions[p_pi->resno];

    OPJ_BYTE *l_header_data = 00;
    OPJ_BYTE **l_header_data_start = 00;

    OPJ_UINT32 l_present;

    if (p_pi->layno == 0) {
        l_band = l_res->bands;

        /* reset tagtrees */
        for (bandno = 0; bandno < l_res->numbands; ++bandno) {
            if (!opj_tcd_is_band_empty(l_band)) {
                opj_tcd_precinct_t *l_prc = &l_band->precincts[p_pi->precno];
                if (!(p_pi->precno < (l_band->precincts_data_size / sizeof(
                                          opj_tcd_precinct_t)))) {
                    opj_event_msg(p_manager, EVT_ERROR, "Invalid precinct\n");
                    return OPJ_FALSE;
                }


                opj_tgt_reset(l_prc->incltree);
                opj_tgt_reset(l_prc->imsbtree);
                l_cblk = l_prc->cblks.dec;

                l_nb_code_blocks = l_prc->cw * l_prc->ch;
                for (cblkno = 0; cblkno < l_nb_code_blocks; ++cblkno) {
                    l_cblk->numsegs = 0;
                    l_cblk->real_num_segs = 0;
                    ++l_cblk;
                }
            }

            ++l_band;
        }
    }

    /* SOP markers */

    if (p_tcp->csty & J2K_CP_CSTY_SOP) {
        if (p_max_length < 6) {
            opj_event_msg(p_manager, EVT_WARNING,
                          "Not enough space for expected SOP marker\n");
        } else if ((*l_current_data) != 0xff || (*(l_current_data + 1) != 0x91)) {
            opj_event_msg(p_manager, EVT_WARNING, "Expected SOP marker\n");
        } else {
            l_current_data += 6;
        }

        /** TODO : check the Nsop value */
    }

    /*
    When the marker PPT/PPM is used the packet header are store in PPT/PPM marker
    This part deal with this characteristic
    step 1: Read packet header in the saved structure
    step 2: Return to codestream for decoding
    */

    l_bio = opj_bio_create();
    if (! l_bio) {
        return OPJ_FALSE;
    }

    if (l_cp->ppm == 1) { /* PPM */
        l_header_data_start = &l_cp->ppm_data;
        l_header_data = *l_header_data_start;
        l_modified_length_ptr = &(l_cp->ppm_len);

    } else if (p_tcp->ppt == 1) { /* PPT */
        l_header_data_start = &(p_tcp->ppt_data);
        l_header_data = *l_header_data_start;
        l_modified_length_ptr = &(p_tcp->ppt_len);
    } else { /* Normal Case */
        l_header_data_start = &(l_current_data);
        l_header_data = *l_header_data_start;
        l_remaining_length = (OPJ_UINT32)(p_src_data + p_max_length - l_header_data);
        l_modified_length_ptr = &(l_remaining_length);
    }

    opj_bio_init_dec(l_bio, l_header_data, *l_modified_length_ptr);

    l_present = opj_bio_read(l_bio, 1);
    JAS_FPRINTF(stderr, "present=%d \n", l_present);
    if (!l_present) {
        /* TODO MSD: no test to control the output of this function*/
        opj_bio_inalign(l_bio);
        l_header_data += opj_bio_numbytes(l_bio);
        opj_bio_destroy(l_bio);

        /* EPH markers */
        if (p_tcp->csty & J2K_CP_CSTY_EPH) {
            if ((*l_modified_length_ptr - (OPJ_UINT32)(l_header_data -
                    *l_header_data_start)) < 2U) {
                opj_event_msg(p_manager, EVT_WARNING,
                              "Not enough space for expected EPH marker\n");
            } else if ((*l_header_data) != 0xff || (*(l_header_data + 1) != 0x92)) {
                opj_event_msg(p_manager, EVT_WARNING, "Expected EPH marker\n");
            } else {
                l_header_data += 2;
            }
        }

        l_header_length = (OPJ_UINT32)(l_header_data - *l_header_data_start);
        *l_modified_length_ptr -= l_header_length;
        *l_header_data_start += l_header_length;

        /* << INDEX */
        /* End of packet header position. Currently only represents the distance to start of packet
           Will be updated later by incrementing with packet start value */
        if (p_pack_info) {
            p_pack_info->end_ph_pos = (OPJ_INT32)(l_current_data - p_src_data);
        }
        /* INDEX >> */

        * p_is_data_present = OPJ_FALSE;
        *p_data_read = (OPJ_UINT32)(l_current_data - p_src_data);
        return OPJ_TRUE;
    }

    l_band = l_res->bands;
    for (bandno = 0; bandno < l_res->numbands; ++bandno, ++l_band) {
        opj_tcd_precinct_t *l_prc = &(l_band->precincts[p_pi->precno]);

        if (opj_tcd_is_band_empty(l_band)) {
            continue;
        }

        l_nb_code_blocks = l_prc->cw * l_prc->ch;
        l_cblk = l_prc->cblks.dec;
        for (cblkno = 0; cblkno < l_nb_code_blocks; cblkno++) {
            OPJ_UINT32 l_included, l_increment, l_segno;
            OPJ_INT32 n;

            /* if cblk not yet included before --> inclusion tagtree */
            if (!l_cblk->numsegs) {
                l_included = opj_tgt_decode(l_bio, l_prc->incltree, cblkno,
                                            (OPJ_INT32)(p_pi->layno + 1));
                /* else one bit */
            } else {
                l_included = opj_bio_read(l_bio, 1);
            }

            /* if cblk not included */
            if (!l_included) {
                l_cblk->numnewpasses = 0;
                ++l_cblk;
                JAS_FPRINTF(stderr, "included=%d \n", l_included);
                continue;
            }

            /* if cblk not yet included --> zero-bitplane tagtree */
            if (!l_cblk->numsegs) {
                OPJ_UINT32 i = 0;

                while (!opj_tgt_decode(l_bio, l_prc->imsbtree, cblkno, (OPJ_INT32)i)) {
                    ++i;
                }

                l_cblk->Mb = (OPJ_UINT32)l_band->numbps;
                l_cblk->numbps = (OPJ_UINT32)l_band->numbps + 1 - i;
                l_cblk->numlenbits = 3;
            }

            /* number of coding passes */
            l_cblk->numnewpasses = opj_t2_getnumpasses(l_bio);
            l_increment = opj_t2_getcommacode(l_bio);

            /* length indicator increment */
            l_cblk->numlenbits += l_increment;
            l_segno = 0;

            if (!l_cblk->numsegs) {
                if (! opj_t2_init_seg(l_cblk, l_segno, p_tcp->tccps[p_pi->compno].cblksty, 1)) {
                    opj_bio_destroy(l_bio);
                    return OPJ_FALSE;
                }
            } else {
                l_segno = l_cblk->numsegs - 1;
                if (l_cblk->segs[l_segno].numpasses == l_cblk->segs[l_segno].maxpasses) {
                    ++l_segno;
                    if (! opj_t2_init_seg(l_cblk, l_segno, p_tcp->tccps[p_pi->compno].cblksty, 0)) {
                        opj_bio_destroy(l_bio);
                        return OPJ_FALSE;
                    }
                }
            }
            n = (OPJ_INT32)l_cblk->numnewpasses;

            if ((p_tcp->tccps[p_pi->compno].cblksty & J2K_CCP_CBLKSTY_HT) != 0)
                do {
                    OPJ_UINT32 bit_number;
                    l_cblk->segs[l_segno].numnewpasses = l_segno == 0 ? 1 : (OPJ_UINT32)n;
                    bit_number = l_cblk->numlenbits + opj_uint_floorlog2(
                                     l_cblk->segs[l_segno].numnewpasses);
                    if (bit_number > 32) {
                        opj_event_msg(p_manager, EVT_ERROR,
                                      "Invalid bit number %d in opj_t2_read_packet_header()\n",
                                      bit_number);
                        opj_bio_destroy(l_bio);
                        return OPJ_FALSE;
                    }
                    l_cblk->segs[l_segno].newlen = opj_bio_read(l_bio, bit_number);
                    JAS_FPRINTF(stderr, "included=%d numnewpasses=%d increment=%d len=%d \n",
                                l_included, l_cblk->segs[l_segno].numnewpasses, l_increment,
                                l_cblk->segs[l_segno].newlen);

                    n -= (OPJ_INT32)l_cblk->segs[l_segno].numnewpasses;
                    if (n > 0) {
                        ++l_segno;

                        if (! opj_t2_init_seg(l_cblk, l_segno, p_tcp->tccps[p_pi->compno].cblksty, 0)) {
                            opj_bio_destroy(l_bio);
                            return OPJ_FALSE;
                        }
                    }
                } while (n > 0);
            else
                do {
                    OPJ_UINT32 bit_number;
                    l_cblk->segs[l_segno].numnewpasses = (OPJ_UINT32)opj_int_min((OPJ_INT32)(
                            l_cblk->segs[l_segno].maxpasses - l_cblk->segs[l_segno].numpasses), n);
                    bit_number = l_cblk->numlenbits + opj_uint_floorlog2(
                                     l_cblk->segs[l_segno].numnewpasses);
                    if (bit_number > 32) {
                        opj_event_msg(p_manager, EVT_ERROR,
                                      "Invalid bit number %d in opj_t2_read_packet_header()\n",
                                      bit_number);
                        opj_bio_destroy(l_bio);
                        return OPJ_FALSE;
                    }
                    l_cblk->segs[l_segno].newlen = opj_bio_read(l_bio, bit_number);
                    JAS_FPRINTF(stderr, "included=%d numnewpasses=%d increment=%d len=%d \n",
                                l_included, l_cblk->segs[l_segno].numnewpasses, l_increment,
                                l_cblk->segs[l_segno].newlen);

                    n -= (OPJ_INT32)l_cblk->segs[l_segno].numnewpasses;
                    if (n > 0) {
                        ++l_segno;

                        if (! opj_t2_init_seg(l_cblk, l_segno, p_tcp->tccps[p_pi->compno].cblksty, 0)) {
                            opj_bio_destroy(l_bio);
                            return OPJ_FALSE;
                        }
                    }
                } while (n > 0);

            ++l_cblk;
        }
    }

    if (!opj_bio_inalign(l_bio)) {
        opj_bio_destroy(l_bio);
        return OPJ_FALSE;
    }

    l_header_data += opj_bio_numbytes(l_bio);
    opj_bio_destroy(l_bio);

    /* EPH markers */
    if (p_tcp->csty & J2K_CP_CSTY_EPH) {
        if ((*l_modified_length_ptr - (OPJ_UINT32)(l_header_data -
                *l_header_data_start)) < 2U) {
            opj_event_msg(p_manager, EVT_WARNING,
                          "Not enough space for expected EPH marker\n");
        } else if ((*l_header_data) != 0xff || (*(l_header_data + 1) != 0x92)) {
            opj_event_msg(p_manager, EVT_WARNING, "Expected EPH marker\n");
        } else {
            l_header_data += 2;
        }
    }

    l_header_length = (OPJ_UINT32)(l_header_data - *l_header_data_start);
    JAS_FPRINTF(stderr, "hdrlen=%d \n", l_header_length);
    JAS_FPRINTF(stderr, "packet body\n");
    *l_modified_length_ptr -= l_header_length;
    *l_header_data_start += l_header_length;

    /* << INDEX */
    /* End of packet header position. Currently only represents the distance to start of packet
     Will be updated later by incrementing with packet start value */
    if (p_pack_info) {
        p_pack_info->end_ph_pos = (OPJ_INT32)(l_current_data - p_src_data);
    }
    /* INDEX >> */

    *p_is_data_present = OPJ_TRUE;
    *p_data_read = (OPJ_UINT32)(l_current_data - p_src_data);

    return OPJ_TRUE;
}